

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void createPlayerMapping(void)

{
  pair<const_char_*,_Player_*(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_28;
  
  local_28.first = "Patrick";
  local_28.second = createInstance<ExampleBot>;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
  ::_M_emplace_unique<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
              *)&map_abi_cxx11_,&local_28);
  local_28.first = "Felix";
  local_28.second = createInstance<ExampleBot>;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
  ::_M_emplace_unique<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
              *)&map_abi_cxx11_,&local_28);
  local_28.first = "Christoph";
  local_28.second = createInstance<ExampleBot>;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
  ::_M_emplace_unique<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
              *)&map_abi_cxx11_,&local_28);
  local_28.first = "Juergen";
  local_28.second = createInstance<ExampleBot>;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
  ::_M_emplace_unique<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
              *)&map_abi_cxx11_,&local_28);
  local_28.first = "Mathias";
  local_28.second = createInstance<ExampleBot>;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
  ::_M_emplace_unique<std::pair<char_const*,Player*(*)(std::__cxx11::string)>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>,std::_Select1st<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Player*(*)(std::__cxx11::string)>>>
              *)&map_abi_cxx11_,&local_28);
  return;
}

Assistant:

void createPlayerMapping() {
    map.insert(std::make_pair("Patrick", &createInstance<ExampleBot>));
    map.insert(std::make_pair("Felix", &createInstance<ExampleBot>));
    map.insert(std::make_pair("Christoph", &createInstance<ExampleBot>));
    map.insert(std::make_pair("Juergen", &createInstance<ExampleBot>));
    map.insert(std::make_pair("Mathias", &createInstance<ExampleBot>));
}